

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O2

EnvNAVXYTHETALATHashEntry_t * __thiscall
EnvironmentNAVXYTHETALAT::CreateNewHashEntry_lookup
          (EnvironmentNAVXYTHETALAT *this,int X,int Y,int Theta)

{
  pointer ppiVar1;
  SBPL_Exception *this_00;
  long lVar2;
  int *entry;
  EnvNAVXYTHETALATHashEntry_t *HashEntry;
  
  HashEntry = (EnvNAVXYTHETALATHashEntry_t *)operator_new(0x14);
  HashEntry->X = X;
  HashEntry->Y = Y;
  HashEntry->Theta = (char)Theta;
  HashEntry->iteration = 0;
  HashEntry->stateID =
       (int)((ulong)((long)(this->StateID2CoordTable).
                           super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->StateID2CoordTable).
                          super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3);
  std::vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>::
  push_back(&this->StateID2CoordTable,&HashEntry);
  this->Coord2StateIDHashTable_lookup
  [(Y * (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.EnvWidth_c + X) *
   (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.NumThetaDirs + Theta] = HashEntry;
  entry = (int *)operator_new__(8);
  std::vector<int_*,_std::allocator<int_*>_>::push_back
            (&(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
              StateID2IndexMapping,&entry);
  ppiVar1 = (this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
            StateID2IndexMapping.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 2) break;
    ppiVar1[HashEntry->stateID][lVar2] = -1;
    lVar2 = lVar2 + 1;
  }
  if (HashEntry->stateID ==
      (int)((ulong)((long)(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
                          StateID2IndexMapping.super__Vector_base<int_*,_std::allocator<int_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppiVar1) >> 3) + -1) {
    return HashEntry;
  }
  this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
  SBPL_Exception::SBPL_Exception
            (this_00,"ERROR in Env... function: last state has incorrect stateID");
  __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

EnvNAVXYTHETALATHashEntry_t*
EnvironmentNAVXYTHETALAT::CreateNewHashEntry_lookup(int X, int Y, int Theta)
{
    int i;

#if TIME_DEBUG
    clock_t currenttime = clock();
#endif

    EnvNAVXYTHETALATHashEntry_t* HashEntry = new EnvNAVXYTHETALATHashEntry_t;

    HashEntry->X = X;
    HashEntry->Y = Y;
    HashEntry->Theta = Theta;
    HashEntry->iteration = 0;

    HashEntry->stateID = StateID2CoordTable.size();

    // insert into the tables
    StateID2CoordTable.push_back(HashEntry);

    int index = XYTHETA2INDEX(X,Y,Theta);

#if DEBUG
    if (Coord2StateIDHashTable_lookup[index] != NULL) {
        throw SBPL_Exception("ERROR: creating hash entry for non-NULL hashentry");
    }
#endif

    Coord2StateIDHashTable_lookup[index] = HashEntry;

    // insert into and initialize the mappings
    int* entry = new int[NUMOFINDICES_STATEID2IND];
    StateID2IndexMapping.push_back(entry);
    for (i = 0; i < NUMOFINDICES_STATEID2IND; i++) {
        StateID2IndexMapping[HashEntry->stateID][i] = -1;
    }

    if (HashEntry->stateID != (int)StateID2IndexMapping.size() - 1) {
        throw SBPL_Exception("ERROR in Env... function: last state has incorrect stateID");
    }

#if TIME_DEBUG
    time_createhash += clock()-currenttime;
#endif

    return HashEntry;
}